

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

bool __thiscall Config::Read(Config *this,string *filename,bool nowarn)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  FILE *__stream;
  undefined8 uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  mapped_type *this_00;
  variant local_11e8;
  ulong local_11a8;
  size_t loc;
  string local_1198 [6];
  bool nowarn_1;
  string local_1178;
  string local_1158;
  string local_1138;
  string local_1118;
  allocator<char> local_10f1;
  string local_10f0;
  string local_10d0;
  undefined4 local_10b0;
  long local_10a0;
  size_t eqloc;
  string val;
  string key;
  string line;
  char buf [4096];
  FILE *fh;
  bool nowarn_local;
  string *filename_local;
  Config *this_local;
  
  std::__cxx11::string::string((string *)(key.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&eqloc);
  std::__cxx11::string::operator=((string *)&this->filename,(string *)filename);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  __stream = fopen(pcVar3,"rt");
  if (__stream == (FILE *)0x0) {
    if (!nowarn) {
      uVar4 = std::__cxx11::string::c_str();
      Console::Wrn("Configuration file not found: %s",uVar4);
    }
    this_local._7_1_ = false;
  }
  else {
    do {
      while( true ) {
        do {
          iVar2 = feof(__stream);
          if (iVar2 != 0) {
            fclose(__stream);
            this_local._7_1_ = true;
            goto LAB_001537eb;
          }
          pcVar3 = fgets(line.field_2._M_local_buf + 8,0x1000,__stream);
          if (pcVar3 == (char *)0x0) {
            std::__cxx11::string::operator=((string *)(key.field_2._M_local_buf + 8),"");
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_10f0,line.field_2._M_local_buf + 8,&local_10f1);
            util::trim(&local_10d0,&local_10f0);
            std::__cxx11::string::operator=
                      ((string *)(key.field_2._M_local_buf + 8),(string *)&local_10d0);
            std::__cxx11::string::~string((string *)&local_10d0);
            std::__cxx11::string::~string((string *)&local_10f0);
            std::allocator<char>::~allocator(&local_10f1);
          }
          lVar5 = std::__cxx11::string::length();
        } while (((lVar5 == 0) ||
                 (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&key.field_2 + 8))
                 , *pcVar3 == '#')) ||
                (local_10a0 = std::__cxx11::string::find((char)&key + '\x18',0x3d), local_10a0 == -1
                ));
        std::__cxx11::string::substr((ulong)&local_1138,(ulong)((long)&key.field_2 + 8));
        util::rtrim(&local_1118,&local_1138);
        std::__cxx11::string::operator=
                  ((string *)(val.field_2._M_local_buf + 8),(string *)&local_1118);
        std::__cxx11::string::~string((string *)&local_1118);
        std::__cxx11::string::~string((string *)&local_1138);
        uVar6 = std::__cxx11::string::length();
        if (local_10a0 + 1U < uVar6) {
          std::__cxx11::string::substr((ulong)&local_1178,(ulong)((long)&key.field_2 + 8));
          util::ltrim(&local_1158,&local_1178);
          std::__cxx11::string::operator=((string *)&eqloc,(string *)&local_1158);
          std::__cxx11::string::~string((string *)&local_1158);
          std::__cxx11::string::~string((string *)&local_1178);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1198,"",(allocator<char> *)((long)&loc + 7));
          std::__cxx11::string::operator=((string *)&eqloc,local_1198);
          std::__cxx11::string::~string(local_1198);
          std::allocator<char>::~allocator((allocator<char> *)((long)&loc + 7));
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&val.field_2 + 8),"REQUIRE");
        if (bVar1) break;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&val.field_2 + 8),"INCLUDE");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)((long)&val.field_2 + 8),"INCLUDE_NOWARN"), bVar1)) {
          loc._6_1_ = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)((long)&val.field_2 + 8),"INCLUDE_NOWARN");
          Read(this,(string *)&eqloc,(bool)loc._6_1_);
        }
        else {
          local_11a8 = std::__cxx11::string::find((char)&eqloc,0x5c);
          while( true ) {
            uVar6 = local_11a8;
            bVar1 = false;
            if (local_11a8 != 0xffffffffffffffff) {
              uVar7 = std::__cxx11::string::length();
              bVar1 = uVar6 != uVar7;
            }
            if (!bVar1) break;
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&eqloc);
            if (*pcVar3 == 't') {
              std::__cxx11::string::replace((ulong)&eqloc,local_11a8,(char *)0x2);
            }
            else {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&eqloc);
              if (*pcVar3 == 'r') {
                std::__cxx11::string::replace((ulong)&eqloc,local_11a8,(char *)0x2);
              }
              else {
                pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&eqloc);
                if (*pcVar3 == 'n') {
                  std::__cxx11::string::replace((ulong)&eqloc,local_11a8,(char *)0x2);
                }
                else {
                  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&eqloc);
                  if (*pcVar3 == '\\') {
                    std::__cxx11::string::replace((ulong)&eqloc,local_11a8,(char *)0x2);
                  }
                }
              }
            }
            local_11a8 = std::__cxx11::string::find((char)&eqloc,0x5c);
          }
          util::variant::variant(&local_11e8,(string *)&eqloc);
          this_00 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                    ::operator[](&this->
                                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                                 ,(key_type *)((long)&val.field_2 + 8));
          util::variant::operator=(this_00,&local_11e8);
          util::variant::~variant(&local_11e8);
        }
      }
      bVar1 = Read(this,(string *)&eqloc,false);
    } while (bVar1);
    this_local._7_1_ = false;
  }
LAB_001537eb:
  local_10b0 = 1;
  std::__cxx11::string::~string((string *)&eqloc);
  std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool Config::Read(const std::string& filename, bool nowarn)
{
	std::FILE *fh;
	char buf[Config::MaxLineLength];
	std::string line;
	std::string key;
	std::string val;
	std::size_t eqloc;

	this->filename = filename;

	fh = std::fopen(filename.c_str(), "rt");
	if (!fh)
	{
		if (!nowarn)
			Console::Wrn("Configuration file not found: %s", filename.c_str());
		return false;
	}

	while (!std::feof(fh))
	{
		if (std::fgets(buf, Config::MaxLineLength, fh))
		{
			line = util::trim(buf);
		}
		else
		{
			line = "";
		}

		if (line.length() < 1)
		{
			continue;
		}

		if (line[0] == '#')
		{
			continue;
		}

		eqloc = line.find('=');

		if (eqloc == std::string::npos)
		{
			continue;
		}

		key = util::rtrim(line.substr(0, eqloc));

		if (line.length() > eqloc+1)
		{
			val = util::ltrim(line.substr(eqloc+1));
		}
		else
		{
			val = std::string("");
		}

		if (key == "REQUIRE")
		{
			if (!this->Read(val))
				return false;
		}
		else if (key == "INCLUDE" || key == "INCLUDE_NOWARN")
		{
			bool nowarn = (key == "INCLUDE_NOWARN");
			this->Read(val, nowarn);
		}
		else
		{
			std::size_t loc = val.find('\\');
			while (loc != std::string::npos && loc != val.length())
			{
				if (val[loc + 1] == 't')
				{
					val.replace(loc, 2, "\t");
				}
				else if (val[loc + 1] == 'r')
				{
					val.replace(loc, 2, "\r");
				}
				else if (val[loc + 1] == 'n')
				{
					val.replace(loc, 2, "\n");
				}
				else if (val[loc + 1] == '\\')
				{
					val.replace(loc, 2, "\\");
				}

				loc = val.find('\\', loc+1);
			}

			this->operator[](key) = static_cast<util::variant>(val);
		}
	}

	std::fclose(fh);
	return true;
}